

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

R_conflict4 createSlack(QSimplexConstraint *sizeConstraint,qreal interval,slackType type)

{
  long lVar1;
  R_conflict4 RVar2;
  QSimplexConstraint *this;
  QSimplexConstraint *pQVar3;
  long in_FS_OFFSET;
  qreal in_XMM0_Qa;
  QSimplexConstraint *limit;
  QConcreteSimplexVariable *slack;
  QSimplexVariable **in_stack_ffffffffffffff58;
  QSimplexConstraint *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QSimplexConstraint *)operator_new(0x10);
  QConcreteSimplexVariable::QConcreteSimplexVariable((QConcreteSimplexVariable *)0x9429ee);
  this_00 = this;
  QHash<QSimplexVariable_*,_double>::insert
            (&this->variables,in_stack_ffffffffffffff58,(double *)0x942a2e);
  pQVar3 = (QSimplexConstraint *)operator_new(0x30);
  QSimplexConstraint::QSimplexConstraint(this_00);
  QHash<QSimplexVariable_*,_double>::insert
            (&this_00->variables,in_stack_ffffffffffffff58,(double *)0x942a92);
  pQVar3->ratio = LessOrEqual;
  pQVar3->constant = in_XMM0_Qa;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    RVar2.limit = pQVar3;
    RVar2.slack = (QConcreteSimplexVariable *)this;
    return RVar2;
  }
  __stack_chk_fail();
}

Assistant:

static auto createSlack(QSimplexConstraint *sizeConstraint, qreal interval, slackType type)
{
    struct R {
        QConcreteSimplexVariable *slack;
        QSimplexConstraint *limit;
    };

    auto slack = new QConcreteSimplexVariable;
    sizeConstraint->variables.insert(slack, type);

    QSimplexConstraint *limit = new QSimplexConstraint;
    limit->variables.insert(slack, 1.0);
    limit->ratio = QSimplexConstraint::LessOrEqual;
    limit->constant = interval;

    return R{slack, limit};
}